

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClrDirWrapper.cpp
# Opt level: O2

QString * ClrDirWrapper::translateFlag(QString *__return_storage_ptr__,DWORD flags)

{
  char *ch;
  
  if ((flags & 1) == 0) {
    if ((flags & 2) == 0) {
      if ((flags & 4) == 0) {
        if ((flags & 8) == 0) {
          if ((flags & 0x10) == 0) {
            ch = "Track Debug Data";
            if ((flags >> 0x10 & 1) == 0) {
              ch = "";
            }
          }
          else {
            ch = "Native EntryPoint";
          }
        }
        else {
          ch = "Strong Name Signed";
        }
      }
      else {
        ch = "IL Library";
      }
    }
    else {
      ch = "32-bit required";
    }
  }
  else {
    ch = "IL Only";
  }
  QString::QString(__return_storage_ptr__,ch);
  return __return_storage_ptr__;
}

Assistant:

QString ClrDirWrapper::translateFlag(DWORD flags)
{
    if (flags & pe::COMIMAGE_FLAGS_ILONLY) {
        return ("IL Only");
    }
    if (flags & pe::COMIMAGE_FLAGS_32BITREQUIRED) {
        return("32-bit required");
    }
    if (flags & pe::COMIMAGE_FLAGS_IL_LIBRARY) {
        return ("IL Library");
    }
    if (flags & pe::COMIMAGE_FLAGS_STRONGNAMESIGNED) {
        return("Strong Name Signed");
    }
    if (flags & pe::COMIMAGE_FLAGS_NATIVE_ENTRYPOINT) {
        return("Native EntryPoint");
    }
    if (flags & pe::COMIMAGE_FLAGS_TRACKDEBUGDATA) {
        return("Track Debug Data");
    }
    return "";
}